

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

quaternion * quaternion_get_rotation_tov3(vector3 *from,vector3 *to,quaternion *qR)

{
  short sVar1;
  float fVar2;
  float norm;
  float dot;
  vector3 w;
  quaternion *qR_local;
  vector3 *to_local;
  vector3 *from_local;
  
  w.field_0._4_8_ = qR;
  vector3_cross_product((vector3 *)&norm,from,to);
  fVar2 = vector3_dot_product(from,to);
  *(float *)w.field_0._4_8_ = norm;
  *(float *)(w.field_0._4_8_ + 4) = dot;
  *(float *)(w.field_0._4_8_ + 8) = w.field_0.v[0];
  *(float *)(w.field_0._4_8_ + 0xc) = fVar2;
  fVar2 = quaternion_norm((quaternion *)w.field_0._4_8_);
  *(float *)(w.field_0._4_8_ + 0xc) = fVar2 + *(float *)(w.field_0._4_8_ + 0xc);
  sVar1 = scalar_equalsf(fVar2,0.0);
  if (sVar1 == 0) {
    *(float *)w.field_0._4_8_ = *(float *)w.field_0._4_8_ / fVar2;
    *(float *)(w.field_0._4_8_ + 4) = *(float *)(w.field_0._4_8_ + 4) / fVar2;
    *(float *)(w.field_0._4_8_ + 8) = *(float *)(w.field_0._4_8_ + 8) / fVar2;
    *(float *)(w.field_0._4_8_ + 0xc) = *(float *)(w.field_0._4_8_ + 0xc) / fVar2;
  }
  return (quaternion *)w.field_0._4_8_;
}

Assistant:

HYPAPI struct quaternion *quaternion_get_rotation_tov3(const struct vector3 *from, const struct vector3 *to, struct quaternion *qR)
{
	/* this code avoids sqrt and cos and sin and would be nice to
	 * avoid division
	 */
	struct vector3 w;
	HYP_FLOAT dot;
	HYP_FLOAT norm;

	vector3_cross_product(&w, from, to);
	dot = vector3_dot_product(from, to);

	qR->x = w.x;
	qR->y = w.y;
	qR->z = w.z;
	qR->w = dot;

	norm = quaternion_norm(qR);
	qR->w += norm;

	/* normalization with avoidance of div/0 and reusing the norm */
	/* (already calculated above) */
	if (!scalar_equalsf(norm, 0.0f)) {
		qR->x /= norm;
		qR->y /= norm;
		qR->z /= norm;
		qR->w /= norm;
	}

	return qR;
}